

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

ast * sibling(ast *a,int n)

{
  ast *ret;
  bool bVar1;
  
  if (n < 0) {
    for (; (n != 0 && (a != (ast *)0x0)); a = a->pre) {
      n = n + 1;
    }
  }
  else {
    for (; (bVar1 = n != 0, n = n + -1, bVar1 && (a != (ast *)0x0)); a = a->right) {
    }
  }
  return a;
}

Assistant:

struct ast *sibling(struct ast *a, int n) {
    struct ast *ret = a;
    if (n >= 0) {
        while (n-- && ret)
            ret = ret->right;
    }
    else {
        n = -n;
        while (n-- && ret)
            ret = ret->pre;
    }
    return ret;
}